

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_json.hpp
# Opt level: O0

void jsoncons::
     encode_json<(anonymous_namespace)::ns::TemplatedStruct<int,double>,std::__cxx11::string>
               (TemplatedStruct<int,_double> *val,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cont,
               indenting indent)

{
  char in_DL;
  basic_json_encode_options<char> *in_RSI;
  basic_json_encode_options<char> *in_RDI;
  TemplatedStruct<int,_double> *unaff_retaddr;
  indenting in_stack_0000019f;
  basic_json_encode_options<char> *in_stack_000001a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000001a8;
  TemplatedStruct<int,_double> *in_stack_000001b0;
  basic_json_encode_options<char> *in_stack_fffffffffffffd80;
  basic_json_encode_options<char> *in_stack_fffffffffffffd90;
  
  if (in_DL == '\x01') {
    basic_json_encode_options<char>::basic_json_encode_options(in_RDI);
    encode_json_pretty<(anonymous_namespace)::ns::TemplatedStruct<int,double>,std::__cxx11::string>
              (unaff_retaddr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,in_RSI);
    basic_json_encode_options<char>::~basic_json_encode_options(in_stack_fffffffffffffd80);
  }
  else {
    basic_json_encode_options<char>::basic_json_encode_options(in_stack_fffffffffffffd90);
    encode_json<(anonymous_namespace)::ns::TemplatedStruct<int,double>,std::__cxx11::string>
              (in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,in_stack_0000019f);
    basic_json_encode_options<char>::~basic_json_encode_options(in_RSI);
  }
  return;
}

Assistant:

void encode_json(const T& val, CharContainer& cont, indenting indent)
    {
        if (indent == indenting::indent)
        {
            encode_json_pretty(val,cont);
        }
        else
        {
            encode_json(val,cont);
        }
    }